

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O1

void __thiscall
AdvancedMipsGenerator::Transform2REG(AdvancedMipsGenerator *this,string *in,string *out)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  bVar1 = REGJudge(this,in);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)out);
    return;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"$v0","");
  __n = in->_M_string_length;
  if (__n == local_40) {
    if (__n == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = bcmp((in->_M_dataplus)._M_p,local_48,__n);
      bVar1 = iVar2 == 0;
    }
  }
  else {
    bVar1 = false;
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (bVar1) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)out->_M_string_length,0x162b86);
  }
  return;
}

Assistant:

void AdvancedMipsGenerator::Transform2REG(const string& in, string& out) {
    if (REGJudge(in)) {
        out = in;
    } else if (in == V0_REG) {
        out = "$v0";
    }
}